

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.cc
# Opt level: O0

void __thiscall gss::Timeout::stop(Timeout *this)

{
  bool bVar1;
  unique_lock<std::mutex> *in_RDI;
  unique_lock<std::mutex> guard;
  mutex_type *in_stack_ffffffffffffffd8;
  atomic<bool> *in_stack_ffffffffffffffe8;
  
  std::unique_ptr<gss::Timeout::Detail,_std::default_delete<gss::Timeout::Detail>_>::operator->
            ((unique_ptr<gss::Timeout::Detail,_std::default_delete<gss::Timeout::Detail>_> *)
             0x14ac48);
  bVar1 = std::thread::joinable((thread *)in_RDI);
  if (bVar1) {
    std::unique_ptr<gss::Timeout::Detail,_std::default_delete<gss::Timeout::Detail>_>::operator->
              ((unique_ptr<gss::Timeout::Detail,_std::default_delete<gss::Timeout::Detail>_> *)
               0x14ac64);
    std::unique_lock<std::mutex>::unique_lock(in_RDI,in_stack_ffffffffffffffd8);
    std::unique_ptr<gss::Timeout::Detail,_std::default_delete<gss::Timeout::Detail>_>::operator->
              ((unique_ptr<gss::Timeout::Detail,_std::default_delete<gss::Timeout::Detail>_> *)
               0x14ac7f);
    std::atomic<bool>::store
              (in_stack_ffffffffffffffe8,SUB81((ulong)in_RDI >> 0x38,0),(memory_order)in_RDI);
    std::unique_ptr<gss::Timeout::Detail,_std::default_delete<gss::Timeout::Detail>_>::operator->
              ((unique_ptr<gss::Timeout::Detail,_std::default_delete<gss::Timeout::Detail>_> *)
               0x14ac9f);
    std::condition_variable::notify_all();
    std::unique_lock<std::mutex>::~unique_lock(in_RDI);
    std::unique_ptr<gss::Timeout::Detail,_std::default_delete<gss::Timeout::Detail>_>::operator->
              ((unique_ptr<gss::Timeout::Detail,_std::default_delete<gss::Timeout::Detail>_> *)
               0x14acbf);
    std::thread::join();
  }
  return;
}

Assistant:

auto Timeout::stop() -> void
{
    /* Clean up the timeout thread */
    if (_detail->timeout_thread.joinable()) {
        {
            unique_lock<mutex> guard(_detail->timeout_mutex);
            _detail->abort.store(true);
            _detail->timeout_cv.notify_all();
        }
        _detail->timeout_thread.join();
    }
}